

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_280db::ArenaTest_FuzzAllocSpaceAllocatedRace_Test::
~ArenaTest_FuzzAllocSpaceAllocatedRace_Test(ArenaTest_FuzzAllocSpaceAllocatedRace_Test *this)

{
  ArenaTest_FuzzAllocSpaceAllocatedRace_Test *this_local;
  
  ~ArenaTest_FuzzAllocSpaceAllocatedRace_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ArenaTest, FuzzAllocSpaceAllocatedRace) {
  upb_Arena_SetMaxBlockSize(128);
  absl::Cleanup reset_max_block_size = [] {
    upb_Arena_SetMaxBlockSize(UPB_PRIVATE(kUpbDefaultMaxBlockSize));
  };
  upb_Arena* arena = upb_Arena_New();
  absl::Notification done;
  std::vector<std::thread> threads;
  for (int i = 0; i < 1; ++i) {
    threads.emplace_back([&]() {
      while (!done.HasBeenNotified()) {
        size_t count;
        upb_Arena_SpaceAllocated(arena, &count);
      }
    });
  }

  auto end = absl::Now() + absl::Seconds(2);
  uintptr_t total = 0;
  while (absl::Now() < end && total < 10000000) {
    if (upb_Arena_Malloc(arena, 128) == nullptr) {
      break;
    }
    total += 128;
  }
  done.Notify();
  for (auto& t : threads) t.join();
  upb_Arena_Free(arena);
}